

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport_p.h
# Opt level: O0

qreal __thiscall KDReports::HeaderMap::height(HeaderMap *this)

{
  bool bVar1;
  Header **ppHVar2;
  TextDocument *this_00;
  double *pdVar3;
  QSizeF local_48;
  qreal local_38;
  Header *local_30;
  Header *header;
  const_iterator local_20;
  const_iterator it;
  qreal maxHeight;
  HeaderMap *this_local;
  
  it.i._M_node = (const_iterator)(_Base_ptr)0x0;
  local_20._M_node =
       (_Base_ptr)
       QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::begin
                 (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
  while( true ) {
    header = (Header *)
             QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::end
                       (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
    bVar1 = ::operator!=((const_iterator *)&local_20,(const_iterator *)&header);
    if (!bVar1) break;
    ppHVar2 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::const_iterator::value
                        ((const_iterator *)&local_20);
    local_30 = *ppHVar2;
    this_00 = Header::doc(local_30);
    TextDocument::contentDocument(this_00);
    local_48.wd = (qreal)QTextDocument::size();
    local_38 = QSizeF::height(&local_48);
    pdVar3 = qMax<double>((double *)&it,&local_38);
    it.i._M_node = (const_iterator)*pdVar3;
    QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::const_iterator::operator++
              ((const_iterator *)&local_20);
  }
  return (qreal)it.i._M_node._M_node;
}

Assistant:

qreal height() const
    {
        qreal maxHeight = 0;
        for (const_iterator it = begin(); it != end(); ++it) {
            Header *header = it.value();
            maxHeight = qMax(maxHeight, header->doc().contentDocument().size().height());
        }
        return maxHeight;
    }